

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O3

void __thiscall cfd::Psbt::SetWitnessUtxoData(Psbt *this,UtxoData *utxo)

{
  uint32_t uVar1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  OutPoint outpoint;
  Script redeem_script;
  TxOut txout;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> local_128;
  OutPoint local_110;
  Script local_e8;
  code *local_b0 [3];
  Script local_98;
  undefined1 local_60 [80];
  
  cfd::core::OutPoint::OutPoint(&local_110);
  local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&local_e8);
  cfd::core::TxOut::TxOut((TxOut *)local_b0);
  ConvertFromUtxoData(utxo,&local_110,(TxOut *)local_b0,&local_128,&local_e8,false,(NetType *)0x0);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)local_60,(TxOut *)local_b0);
  uVar1 = GetTxInIndex(this,&local_110);
  cfd::core::Psbt::SetTxInUtxo
            ((uint)this,(TxOutReference *)(ulong)uVar1,(Script *)local_60,(vector *)&local_e8);
  local_60._0_8_ = &PTR__AbstractTxOutReference_002b1160;
  core::Script::~Script((Script *)(local_60 + 0x18));
  local_b0[0] = cfd::core::ExtPrivkey::IsValid;
  core::Script::~Script(&local_98);
  core::Script::~Script(&local_e8);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&local_128);
  local_110.txid_._vptr_Txid = (_func_int **)&PTR__Txid_002b0f00;
  if (local_110.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_110.txid_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Psbt::SetWitnessUtxoData(const UtxoData& utxo) {
  OutPoint outpoint;
  std::vector<KeyData> key_list;
  Script redeem_script;
  TxOut txout;
  ConvertFromUtxoData(utxo, &outpoint, &txout, &key_list, &redeem_script);
  SetTxInUtxo(outpoint, TxOutReference(txout), redeem_script, key_list);
}